

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

object * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
value_abi_cxx11_(object_storage *this)

{
  assertion_error *this_00;
  string local_38;
  
  if (*(object **)(this + 8) != (object *)0x0) {
    return *(object **)(this + 8);
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"assertion \'ptr_ != nullptr\' failed at  <> :0","");
  assertion_error::assertion_error(this_00,&local_38);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

object& value()
            {
                JSONCONS_ASSERT(ptr_ != nullptr);
                return *ptr_;
            }